

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

string * __thiscall Board::getHash_abi_cxx11_(string *__return_storage_ptr__,Board *this)

{
  long lVar1;
  long lVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      std::__cxx11::to_string(&local_70,this->cells[0][lVar1]);
      std::operator+(&local_50,__return_storage_ptr__,&local_70);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    this = (Board *)(this->cells + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Board::getHash() {
    string hash = string();
    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            hash = hash + std::to_string(this->cells[i][j]);
        }
    }

    return hash;
}